

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPutF(Vec_Str_t *vOut,float Val)

{
  Vec_StrPush(vOut,SUB41(Val,0));
  Vec_StrPush(vOut,(char)((uint)Val >> 8));
  Vec_StrPush(vOut,(char)((uint)Val >> 0x10));
  Vec_StrPush(vOut,(char)((uint)Val >> 0x18));
  return;
}

Assistant:

static inline void Vec_StrPutF( Vec_Str_t * vOut, float Val )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.num = Val;
    Vec_StrPush( vOut, tmp.data[0] );
    Vec_StrPush( vOut, tmp.data[1] );
    Vec_StrPush( vOut, tmp.data[2] );
    Vec_StrPush( vOut, tmp.data[3] );
}